

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

void strscan_double(uint64_t x,TValue *o,int32_t ex2,int32_t neg)

{
  long lVar1;
  ulong uVar2;
  int in_ECX;
  int in_EDX;
  double *in_RSI;
  ulong in_RDI;
  uint64_t rb;
  int32_t b;
  double n;
  double local_20;
  ulong local_8;
  
  local_8 = in_RDI;
  if (in_EDX < -0x432 && in_RDI != 0) {
    lVar1 = 0x3f;
    if (in_RDI != 0) {
      for (; in_RDI >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    if (((int)lVar1 + in_EDX < -0x3fe) && (-0x434 < (int)lVar1 + in_EDX)) {
      uVar2 = 1L << (-(char)in_EDX - 0x33U & 0x3f);
      if (((in_RDI & uVar2) != 0) && ((in_RDI & uVar2 * 3 - 1) != 0)) {
        local_8 = uVar2 * 2 + in_RDI;
      }
      local_8 = local_8 & (uVar2 * 2 - 1 ^ 0xffffffffffffffff);
    }
  }
  local_20 = (double)(long)local_8;
  if (in_ECX != 0) {
    local_20 = -local_20;
  }
  if (in_EDX != 0) {
    local_20 = ldexp(local_20,in_EDX);
  }
  *in_RSI = local_20;
  return;
}

Assistant:

static void strscan_double(uint64_t x, TValue *o, int32_t ex2, int32_t neg)
{
  double n;

  /* Avoid double rounding for denormals. */
  if (LJ_UNLIKELY(ex2 <= -1075 && x != 0)) {
    /* NYI: all of this generates way too much code on 32 bit CPUs. */
#if defined(__GNUC__) && LJ_64
    int32_t b = (int32_t)(__builtin_clzll(x)^63);
#else
    int32_t b = (x>>32) ? 32+(int32_t)lj_fls((uint32_t)(x>>32)) :
			  (int32_t)lj_fls((uint32_t)x);
#endif
    if ((int32_t)b + ex2 <= -1023 && (int32_t)b + ex2 >= -1075) {
      uint64_t rb = (uint64_t)1 << (-1075-ex2);
      if ((x & rb) && ((x & (rb+rb+rb-1)))) x += rb+rb;
      x = (x & ~(rb+rb-1));
    }
  }

  /* Convert to double using a signed int64_t conversion, then rescale. */
  lua_assert((int64_t)x >= 0);
  n = (double)(int64_t)x;
  if (neg) n = -n;
  if (ex2) n = ldexp(n, ex2);
  o->n = n;
}